

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall FWeaponSlots::PrintSettings(FWeaponSlots *this)

{
  int iVar1;
  PClassWeapon *pPVar2;
  char *pcVar3;
  uint uVar4;
  int local_1c;
  int j;
  int slot;
  int i;
  FWeaponSlots *this_local;
  
  for (j = 1; j < 0xb; j = j + 1) {
    uVar4 = j % 10;
    iVar1 = FWeaponSlot::Size(this->Slots + (int)uVar4);
    if (0 < iVar1) {
      Printf("Slot[%d]=",(ulong)uVar4);
      local_1c = 0;
      while( true ) {
        iVar1 = FWeaponSlot::Size(this->Slots + (int)uVar4);
        if (iVar1 <= local_1c) break;
        pPVar2 = FWeaponSlot::GetWeapon(this->Slots + (int)uVar4,local_1c);
        pcVar3 = FName::GetChars(&(pPVar2->super_PClassInventory).super_PClassActor.super_PClass.
                                  super_PStruct.super_PNamedType.TypeName);
        Printf("%s ",pcVar3);
        local_1c = local_1c + 1;
      }
      Printf("\n");
    }
  }
  return;
}

Assistant:

void FWeaponSlots::PrintSettings()
{
	for (int i = 1; i <= NUM_WEAPON_SLOTS; ++i)
	{
		int slot = i % NUM_WEAPON_SLOTS;
		if (Slots[slot].Size() > 0)
		{
			Printf("Slot[%d]=", slot);
			for (int j = 0; j < Slots[slot].Size(); ++j)
			{
				Printf("%s ", Slots[slot].GetWeapon(j)->TypeName.GetChars());
			}
			Printf("\n");
		}
	}
}